

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_internals.c
# Opt level: O0

ErrorNumber test_internals(void)

{
  ErrorNumber retValue;
  ErrorNumber local_4;
  
  printf("Testing utility functions\n");
  local_4 = testCircularBuffer();
  if (local_4 == TA_TEST_PASS) {
    local_4 = TA_TEST_PASS;
  }
  else {
    printf("\nFailed: Circular buffer tests (%d)\n",(ulong)local_4);
  }
  return local_4;
}

Assistant:

ErrorNumber test_internals( void )
{
   ErrorNumber retValue;

   printf( "Testing utility functions\n" );

   retValue = testCircularBuffer();
   if( retValue != TA_TEST_PASS )
   {
      printf( "\nFailed: Circular buffer tests (%d)\n", retValue );
      return retValue;
   }

   return TA_TEST_PASS; /* Success. */
}